

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linf.c
# Opt level: O0

void linfcmp(lindef *lin,uchar *buf)

{
  uint uVar1;
  ulong uVar2;
  mcmcxdef *ctx;
  long lVar3;
  undefined4 *in_RSI;
  long in_RDI;
  uchar *objptr;
  int in_stack_00000010;
  uint pg;
  mcmcxdef *in_stack_00000028;
  undefined6 in_stack_ffffffffffffffd8;
  mcmon in_stack_ffffffffffffffde;
  errcxdef *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar2 = *(ulong *)(in_RDI + 0x260) >> 10;
  uVar1 = (uint)uVar2;
  if (0x7f < uVar1) {
    errsigf(in_stack_ffffffffffffffe0,
            (char *)CONCAT26(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8),0);
  }
  if (*(short *)(in_RDI + 0x160 + (uVar2 & 0xffffffff) * 2) == -1) {
    ctx = (mcmcxdef *)mcmalo0(in_stack_00000028,lin._6_2_,(mcmon *)buf,pg._2_2_,in_stack_00000010);
  }
  else {
    ctx = (mcmcxdef *)
          mcmlck((mcmcxdef *)CONCAT44(uVar1,in_stack_ffffffffffffffe8),
                 (mcmon)((ulong)in_stack_ffffffffffffffe0 >> 0x30));
  }
  *(undefined4 *)((long)ctx->mcmcxmtb + (*(ulong *)(in_RDI + 0x260) & 0x3ff) * 4 + -0x30) = *in_RSI;
  *(long *)(in_RDI + 0x260) = *(long *)(in_RDI + 0x260) + 1;
  lVar3 = *(long *)(*(long *)**(undefined8 **)(in_RDI + 0x158) +
                   (long)((int)(uint)*(ushort *)
                                      (*(long *)(*(long *)(in_RDI + 0x158) + 0x30 +
                                                (long)((int)(uint)*(ushort *)
                                                                   (in_RDI + 0x160 +
                                                                   (ulong)uVar1 * 2) >> 8) * 8) +
                                      (long)(int)(*(ushort *)(in_RDI + 0x160 + (ulong)uVar1 * 2) &
                                                 0xff) * 2) >> 8) * 8) +
          (long)(int)(*(ushort *)
                       (*(long *)(*(long *)(in_RDI + 0x158) + 0x30 +
                                 (long)((int)(uint)*(ushort *)(in_RDI + 0x160 + (ulong)uVar1 * 2) >>
                                       8) * 8) +
                       (long)(int)(*(ushort *)(in_RDI + 0x160 + (ulong)uVar1 * 2) & 0xff) * 2) &
                     0xff) * 0x20;
  *(ushort *)(lVar3 + 0x14) = *(ushort *)(lVar3 + 0x14) | 1;
  mcmunlck(ctx,in_stack_ffffffffffffffde);
  return;
}

Assistant:

void linfcmp(lindef *lin, uchar *buf)
{
    uint    pg;
    uchar  *objptr;
#   define  linf ((linfdef *)lin)

    /* figure out which page to use, and lock it */
    pg = linf->linfcrec >> 10;                     /* 2^10 records per page */
    if (pg >= LINFPGMAX)
        errsig(linf->linfmem->mcmcxgl->mcmcxerr, ERR_MANYDBG);
    if (linf->linfpg[pg] == MCMONINV)
        objptr = mcmalo(linf->linfmem, (ushort)(1024 * DBGLINFSIZ),
                        &linf->linfpg[pg]);
    else
        objptr = mcmlck(linf->linfmem, linf->linfpg[pg]);
    
    /* write the record to the appropriate offset within the page */
    memcpy(objptr + (linf->linfcrec & 1023) * DBGLINFSIZ, buf,
           (size_t)DBGLINFSIZ);
    
    /* increment counter of line records so far */
    ++(linf->linfcrec);
    
    /* done with page - touch it and unlock it */
    mcmtch(linf->linfmem, linf->linfpg[pg]);
    mcmunlck(linf->linfmem, linf->linfpg[pg]);
    
#   undef linf
}